

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printanymem(MCInst *MI,uint OpNo,SStream *O)

{
  int iVar1;
  long in_RDI;
  uint in_stack_0000002c;
  MCInst *in_stack_00000030;
  
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 == 0x4d7) {
    *(undefined1 *)(in_RDI + 0x328) = 2;
  }
  else if (iVar1 - 0x4d8U < 2) {
    *(undefined1 *)(in_RDI + 0x328) = 4;
  }
  else if (iVar1 == 0x4da) {
    *(undefined1 *)(in_RDI + 0x328) = 8;
  }
  printMemReference(in_stack_00000030,in_stack_0000002c,(SStream *)MI);
  return;
}

Assistant:

static void printanymem(MCInst *MI, unsigned OpNo, SStream *O)
{
	switch(MI->Opcode) {
		default: break;
		case X86_LEA16r:
				 MI->x86opsize = 2;
				 break;
		case X86_LEA32r:
		case X86_LEA64_32r:
				 MI->x86opsize = 4;
				 break;
		case X86_LEA64r:
				 MI->x86opsize = 8;
				 break;
	}
	printMemReference(MI, OpNo, O);
}